

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

civil_day __thiscall
absl::lts_20240722::time_internal::cctz::detail::next_weekday(detail *this,civil_day cd,weekday wd)

{
  weekday wVar1;
  weekday wVar2;
  weekday *pwVar3;
  weekday *pwVar4;
  long lVar5;
  fields fVar6;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a;
  civil_second local_28;
  
  a.f_._8_8_ = cd.f_.y;
  local_28.f_._8_4_ = cd.f_.y._0_4_;
  local_28.f_.ss = cd.f_.y._4_1_;
  local_28.f_.y = (int_least64_t)this;
  wVar2 = get_weekday(&local_28);
  pwVar3 = &DAT_00115360;
  do {
    pwVar4 = pwVar3 + 1;
    wVar1 = *pwVar3;
    pwVar3 = pwVar4;
  } while (wVar2 != wVar1);
  lVar5 = 0;
  do {
    lVar5 = lVar5 + 0x100000000;
    wVar2 = *pwVar4;
    pwVar4 = pwVar4 + 1;
  } while (wVar2 != cd.f_._8_4_);
  a.f_.y = (int_least64_t)this;
  fVar6 = (fields)operator+(a,lVar5 >> 0x20);
  return (civil_day)fVar6;
}

Assistant:

CONSTEXPR_F civil_day next_weekday(civil_day cd, weekday wd) noexcept {
  CONSTEXPR_D weekday k_weekdays_forw[14] = {
      weekday::monday,    weekday::tuesday,  weekday::wednesday,
      weekday::thursday,  weekday::friday,   weekday::saturday,
      weekday::sunday,    weekday::monday,   weekday::tuesday,
      weekday::wednesday, weekday::thursday, weekday::friday,
      weekday::saturday,  weekday::sunday,
  };
  weekday base = get_weekday(cd);
  for (int i = 0;; ++i) {
    if (base == k_weekdays_forw[i]) {
      for (int j = i + 1;; ++j) {
        if (wd == k_weekdays_forw[j]) {
          return cd + (j - i);
        }
      }
    }
  }
}